

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O1

void __thiscall DatalogDatabase::bruteEvalRules(DatalogDatabase *this,ostream *out)

{
  int iVar1;
  int iVar2;
  pointer ppRVar3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar1 = totalTuples(this);
  if (iVar1 == -1) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      ppRVar3 = (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppRVar3) {
        uVar7 = 0;
        do {
          evaluateRule(this,ppRVar3[uVar7],out);
          uVar7 = uVar7 + 1;
          ppRVar3 = (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)(this->rules).
                                       super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3));
      }
      iVar2 = totalTuples(this);
      iVar6 = iVar6 + 1;
      bVar8 = iVar2 != iVar1;
      iVar1 = iVar2;
    } while (bVar8);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Converged after ",0x10);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," passes through the Rules.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void DatalogDatabase::bruteEvalRules(ostream& out)
{
  int ntuples = totalTuples();
  int lastTuples = -1;
  int nits = 0;

  while (ntuples != lastTuples)
  {
    for (size_t k = 0; k < rules.size(); k++)
    {
      evaluateRule(rules[k], out);
    }
    lastTuples = ntuples;
    ntuples = totalTuples();
    nits++;
  }

  out << endl << "Converged after " << nits << " passes through the Rules." << endl << endl;
}